

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

void helicsFilterRemoveTarget(HelicsFilter filt,char *target,HelicsError *err)

{
  Filter *this;
  FilterObject *pFVar1;
  size_t sVar2;
  string_view targetToRemove;
  
  pFVar1 = anon_unknown.dwarf_ba607::getFilterObj(filt,err);
  if ((pFVar1 != (FilterObject *)0x0) && (this = pFVar1->filtPtr, this != (Filter *)0x0)) {
    if (target == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar2 = strlen(target);
      targetToRemove._M_str = target;
      targetToRemove._M_len = sVar2;
      helics::Interface::removeTarget(&this->super_Interface,targetToRemove);
    }
  }
  return;
}

Assistant:

void helicsFilterRemoveTarget(HelicsFilter filt, const char* target, HelicsError* err)
{
    auto* filter = getFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(target, void());
    try {
        filter->removeTarget(target);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}